

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O3

bool __thiscall
slang::ast::ConstraintExprVisitor::visit<slang::ast::ReplicatedAssignmentPatternExpression>
          (ConstraintExprVisitor *this,ReplicatedAssignmentPatternExpression *expr)

{
  uint uVar1;
  int iVar2;
  size_type sVar3;
  pointer ppEVar4;
  Expression *pEVar5;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> pSVar6;
  long lVar7;
  Type *pTVar8;
  bool bVar9;
  RandMode RVar10;
  ExpressionKind EVar11;
  SubroutineKind SVar12;
  Symbol *symbol;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar13;
  Diagnostic *diag;
  SourceLocation SVar14;
  DiagCode code;
  ASTContext *this_00;
  long lVar16;
  SourceRange sourceRange;
  DistVarVisitor distVisitor;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_40;
  uint local_38;
  byte local_33;
  SourceLocation SVar15;
  
  if (this->failed != false) goto LAB_002571f9;
  if (((this->isSoft == true) &&
      (symbol = Expression::getSymbolReference((Expression *)expr,true), symbol != (Symbol *)0x0))
     && (RVar10 = ASTContext::getRandMode(this->context,symbol), RVar10 == RandC)) {
    ASTContext::addDiag(this->context,(DiagCode)0x340008,
                        (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange);
  }
  EVar11 = (expr->super_AssignmentPatternExpressionBase).super_Expression.kind;
  if ((Call < EVar11) || ((0x340000U >> (EVar11 & OpenRange) & 1) == 0)) {
    Expression::visitExpression<slang::ast::Expression_const,slang::ast::ConstraintExprVisitor&>
              (expr->count_,expr->count_,this);
    sVar3 = (expr->super_AssignmentPatternExpressionBase).elements_.size_;
    if (sVar3 != 0) {
      ppEVar4 = (expr->super_AssignmentPatternExpressionBase).elements_.data_;
      lVar16 = 0;
      do {
        pEVar5 = *(Expression **)((long)ppEVar4 + lVar16);
        Expression::visitExpression<slang::ast::Expression_const,slang::ast::ConstraintExprVisitor&>
                  (pEVar5,pEVar5,this);
        lVar16 = lVar16 + 8;
      } while (sVar3 << 3 != lVar16);
    }
    EVar11 = (expr->super_AssignmentPatternExpressionBase).super_Expression.kind;
  }
  bVar9 = true;
  if (0x14 < (int)EVar11) {
    switch(EVar11) {
    case OpenRange:
      goto switchD_002570e2_caseD_1f;
    case Dist:
      local_40 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)this->context;
      local_38 = local_38 & 0xffffff00;
      pEVar5 = (Expression *)(expr->super_AssignmentPatternExpressionBase).elements_.data_;
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::DistVarVisitor&>
                (pEVar5,pEVar5,(DistVarVisitor *)&local_40);
      if ((char)local_38 != '\0') {
        return true;
      }
      ASTContext::addDiag(this->context,(DiagCode)0x370008,pEVar5->sourceRange);
      return true;
    case NewArray:
    case NewClass:
    case CopyClass:
      goto switchD_002570e2_caseD_21;
    case NewCovergroup:
      break;
    default:
      if (EVar11 == Call) {
        SVar12 = CallExpression::getSubroutineKind((CallExpression *)expr);
        if (SVar12 == Task) {
          this_00 = this->context;
          SVar15 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.
                   startLoc;
          SVar14 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc
          ;
          code.subsystem = Statements;
          code.code = 0x44;
          goto LAB_002571f0;
        }
        if (*(char *)&expr[1].super_AssignmentPatternExpressionBase.super_Expression.syntax !=
            '\x01') {
          ppSVar13 = std::
                     get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                               ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                 *)&(expr->super_AssignmentPatternExpressionBase).elements_);
          pSVar6 = *ppSVar13;
          if ((pSVar6->super_Scope).deferredMemberIndex != Invalid) {
            Scope::elaborate(&pSVar6->super_Scope);
          }
          sVar3 = (pSVar6->arguments).size_;
          if (sVar3 != 0) {
            lVar16 = 0;
            do {
              lVar7 = *(long *)((long)(pSVar6->arguments).data_ + lVar16);
              iVar2 = *(int *)(lVar7 + 0x90);
              if (iVar2 == 3) {
                if ((*(byte *)(lVar7 + 0x8c) & 1) == 0) goto LAB_002572b6;
              }
              else if (iVar2 == 1) {
LAB_002572b6:
                this_00 = this->context;
                SVar15 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.
                         startLoc;
                SVar14 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.
                         endLoc;
                code.subsystem = Statements;
                code.code = 0x2d;
                goto LAB_002571f0;
              }
              lVar16 = lVar16 + 8;
            } while (sVar3 << 3 != lVar16);
          }
        }
      }
    }
    goto switchD_002570b5_caseD_5;
  }
  switch(EVar11) {
  case IntegerLiteral:
    SVInt::SVInt((SVInt *)&local_40,
                 (SVIntStorage *)&(expr->super_AssignmentPatternExpressionBase).elements_.size_);
    goto LAB_0025718b;
  case RealLiteral:
  case TimeLiteral:
    this_00 = this->context;
    SVar15 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.startLoc;
    SVar14 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x2a;
    break;
  case UnbasedUnsizedIntegerLiteral:
    UnbasedUnsizedIntegerLiteral::getValue((UnbasedUnsizedIntegerLiteral *)&local_40);
LAB_0025718b:
    if ((0x40 < local_38 || (local_33 & 1) != 0) && ((void *)local_40.val != (void *)0x0)) {
      operator_delete__(local_40.pVal);
    }
    if ((local_33 & 1) == 0) {
      return true;
    }
    this_00 = this->context;
    SVar15 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.startLoc;
    SVar14 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x49;
    break;
  case NullLiteral:
  case UnboundedLiteral:
  case StringLiteral:
  case NamedValue:
  case HierarchicalValue:
  case UnaryOp:
    goto switchD_002570b5_caseD_5;
  case BinaryOp:
    uVar1 = *(uint *)&(expr->super_AssignmentPatternExpressionBase).elements_.data_;
    if ((0x12 < uVar1) || ((0x61800U >> (uVar1 & 0x1f) & 1) == 0)) goto switchD_002570b5_caseD_5;
switchD_002570e2_caseD_21:
    this_00 = this->context;
    SVar15 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.startLoc;
    SVar14 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x13;
    break;
  default:
    if (EVar11 == Streaming) goto switchD_002570e2_caseD_21;
switchD_002570b5_caseD_5:
    pTVar8 = (expr->super_AssignmentPatternExpressionBase).super_Expression.type.ptr;
    if (pTVar8 == (Type *)0x0) {
LAB_002572cb:
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                );
    }
    bVar9 = Type::isValidForRand(pTVar8,Rand);
    if (bVar9) {
      return true;
    }
    diag = ASTContext::addDiag(this->context,(DiagCode)0x290008,
                               (expr->super_AssignmentPatternExpressionBase).super_Expression.
                               sourceRange);
    pTVar8 = (expr->super_AssignmentPatternExpressionBase).super_Expression.type.ptr;
    if (pTVar8 == (Type *)0x0) goto LAB_002572cb;
    ast::operator<<(diag,pTVar8);
    goto LAB_002571f5;
  }
LAB_002571f0:
  sourceRange.endLoc = SVar14;
  sourceRange.startLoc = SVar15;
  ASTContext::addDiag(this_00,code,sourceRange);
LAB_002571f5:
  this->failed = true;
LAB_002571f9:
  bVar9 = false;
switchD_002570e2_caseD_1f:
  return bVar9;
}

Assistant:

bool visit(const T& expr) {
        if (failed)
            return false;

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (isSoft) {
                if (auto sym = expr.getSymbolReference()) {
                    RandMode mode = context.getRandMode(*sym);
                    if (mode == RandMode::RandC)
                        context.addDiag(diag::RandCInSoft, expr.sourceRange);
                }
            }

            if constexpr (is_detected_v<ASTDetectors::visitExprs_t, T, ConstraintExprVisitor>) {
                // Inside call and select expressions we don't care about the types.
                // This allows things like selections of associative arrays and built-in methods
                // on arrays of strings to work as long as the actual operators at the top level
                // don't have those types.
                if (expr.kind != ExpressionKind::ElementSelect &&
                    expr.kind != ExpressionKind::MemberAccess &&
                    expr.kind != ExpressionKind::Call) {
                    expr.visitExprs(*this);
                }
            }

            switch (expr.kind) {
                case ExpressionKind::Streaming:
                case ExpressionKind::NewArray:
                case ExpressionKind::NewClass:
                case ExpressionKind::CopyClass:
                    context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                    return visitInvalid(expr);
                case ExpressionKind::RealLiteral:
                case ExpressionKind::TimeLiteral:
                    context.addDiag(diag::NonIntegralConstraintLiteral, expr.sourceRange);
                    return visitInvalid(expr);
                case ExpressionKind::IntegerLiteral:
                    if (expr.template as<IntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return visitInvalid(expr);
                    }
                    return true;
                case ExpressionKind::UnbasedUnsizedIntegerLiteral:
                    if (expr.template as<UnbasedUnsizedIntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return visitInvalid(expr);
                    }
                    return true;
                case ExpressionKind::BinaryOp: {
                    switch (expr.template as<BinaryExpression>().op) {
                        case BinaryOperator::CaseEquality:
                        case BinaryOperator::CaseInequality:
                        case BinaryOperator::WildcardEquality:
                        case BinaryOperator::WildcardInequality:
                            context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                            return visitInvalid(expr);
                        default:
                            break;
                    }
                    break;
                }
                case ExpressionKind::OpenRange:
                    return true;
                case ExpressionKind::Dist: {
                    // Additional restrictions on dist expressions:
                    // - must contain at least one 'rand' var
                    // - cannot contain any 'randc' vars
                    DistVarVisitor distVisitor(context);
                    auto& left = expr.template as<DistExpression>().left();
                    left.visit(distVisitor);
                    if (!distVisitor.anyRandVars)
                        context.addDiag(diag::RandNeededInDist, left.sourceRange);
                    return true;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.getSubroutineKind() == SubroutineKind::Task) {
                        context.addDiag(diag::TaskInConstraint, expr.sourceRange);
                        return visitInvalid(expr);
                    }

                    if (!call.isSystemCall()) {
                        const SubroutineSymbol& sub = *std::get<0>(call.subroutine);
                        for (auto arg : sub.getArguments()) {
                            if (arg->direction == ArgumentDirection::Out ||
                                (arg->direction == ArgumentDirection::Ref &&
                                 !arg->flags.has(VariableFlags::Const))) {
                                context.addDiag(diag::OutRefFuncConstraint, expr.sourceRange);
                                return visitInvalid(expr);
                            }
                        }
                    }
                    break;
                }
                default:
                    break;
            }

            if (!expr.type->isValidForRand(RandMode::Rand)) {
                context.addDiag(diag::NonIntegralConstraintExpr, expr.sourceRange) << *expr.type;
                return visitInvalid(expr);
            }
        }

        return true;
    }